

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O2

void __thiscall LinuxEvents<0>::report_error(LinuxEvents<0> *this,string *context)

{
  int *piVar1;
  char *__s;
  ostream *poVar2;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (this->working == true) {
    std::operator+(&local_48,context,": ");
    piVar1 = __errno_location();
    __s = strerror(*piVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
    std::operator+(&local_28,&local_48,&local_68);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_28);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this->working = false;
  return;
}

Assistant:

void report_error(const std::string &context) {
     if(working) std::cerr << (context + ": " + std::string(strerror(errno))) << std::endl;
     working = false;
  }